

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

SurfaceInteraction * __thiscall
phyr::Transform::operator()
          (SurfaceInteraction *__return_storage_ptr__,Transform *this,SurfaceInteraction *si)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  Normal3f *pNVar31;
  Normal3f *pNVar32;
  anon_struct_128_6_d0712383_for_shadingGeom *paVar33;
  uint uVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dStack_40;
  Point3<double> local_38;
  
  memset(__return_storage_ptr__,0,0x1b0);
  operator()(&local_38,this,(Point3<double> *)si,&(si->super_Interaction).pfError,
             &(__return_storage_ptr__->super_Interaction).pfError);
  (__return_storage_ptr__->super_Interaction).p.z = local_38.z;
  (__return_storage_ptr__->super_Interaction).p.x = local_38.x;
  (__return_storage_ptr__->super_Interaction).p.y = local_38.y;
  dVar35 = (si->super_Interaction).n.x;
  dVar39 = (si->super_Interaction).n.y;
  dVar36 = (si->super_Interaction).n.z;
  dVar40 = (this->invMat).d[2][2] * dVar36 +
           (this->invMat).d[0][2] * dVar35 + (this->invMat).d[1][2] * dVar39;
  dVar38 = dVar36 * (this->invMat).d[2][0] +
           dVar35 * (this->invMat).d[0][0] + (this->invMat).d[1][0] * dVar39;
  dVar39 = dVar36 * (this->invMat).d[2][1] +
           dVar35 * (this->invMat).d[0][1] + (this->invMat).d[1][1] * dVar39;
  dVar35 = dVar40 * dVar40 + dVar38 * dVar38 + dVar39 * dVar39;
  if (dVar35 < 0.0) {
    dVar35 = sqrt(dVar35);
  }
  else {
    dVar35 = SQRT(dVar35);
  }
  dVar35 = 1.0 / dVar35;
  (__return_storage_ptr__->super_Interaction).n.x = dVar38 * dVar35;
  (__return_storage_ptr__->super_Interaction).n.y = dVar39 * dVar35;
  (__return_storage_ptr__->super_Interaction).n.z = dVar35 * dVar40;
  dVar35 = (si->super_Interaction).wo.x;
  dVar39 = (si->super_Interaction).wo.y;
  dVar36 = (si->super_Interaction).wo.z;
  dVar38 = (this->mat).d[2][2] * dVar36 +
           (this->mat).d[2][0] * dVar35 + (this->mat).d[2][1] * dVar39;
  dVar40 = dVar36 * (this->mat).d[0][2] +
           dVar35 * (this->mat).d[0][0] + (this->mat).d[0][1] * dVar39;
  dVar39 = dVar36 * (this->mat).d[1][2] +
           dVar35 * (this->mat).d[1][0] + (this->mat).d[1][1] * dVar39;
  dVar35 = dVar38 * dVar38 + dVar40 * dVar40 + dVar39 * dVar39;
  if (dVar35 < 0.0) {
    dVar35 = sqrt(dVar35);
  }
  else {
    dVar35 = SQRT(dVar35);
  }
  dVar35 = 1.0 / dVar35;
  (__return_storage_ptr__->super_Interaction).wo.x = dVar40 * dVar35;
  (__return_storage_ptr__->super_Interaction).wo.y = dVar39 * dVar35;
  (__return_storage_ptr__->super_Interaction).wo.z = dVar35 * dVar38;
  dVar35 = (si->uv).y;
  (__return_storage_ptr__->uv).x = (si->uv).x;
  (__return_storage_ptr__->uv).y = dVar35;
  __return_storage_ptr__->shape = si->shape;
  dVar6 = (si->dpdu).x;
  dVar7 = (si->dpdu).y;
  dVar8 = (si->dpdu).z;
  dVar35 = (this->mat).d[1][1];
  dVar39 = (this->mat).d[0][0];
  dVar36 = (this->mat).d[0][1];
  dVar38 = (this->mat).d[0][2];
  dVar40 = (this->mat).d[1][0];
  dVar1 = (this->mat).d[2][1];
  dVar2 = (this->mat).d[2][0];
  dVar3 = (this->mat).d[1][2];
  dVar4 = (this->mat).d[2][2];
  dVar18 = dVar8 * dVar38 + dVar6 * dVar39 + dVar36 * dVar7;
  dVar19 = dVar8 * dVar3 + dVar6 * dVar40 + dVar35 * dVar7;
  auVar17._8_4_ = SUB84(dVar19,0);
  auVar17._0_8_ = dVar18;
  auVar17._12_4_ = (int)((ulong)dVar19 >> 0x20);
  (__return_storage_ptr__->dpdu).x = dVar18;
  (__return_storage_ptr__->dpdu).y = (double)auVar17._8_8_;
  dVar18 = (si->dpdv).x;
  dVar19 = (si->dpdv).y;
  dVar5 = (si->dpdv).z;
  (__return_storage_ptr__->dpdu).z = dVar8 * dVar4 + dVar6 * dVar2 + dVar7 * dVar1;
  (__return_storage_ptr__->dpdv).x = dVar5 * dVar38 + dVar18 * dVar39 + dVar19 * dVar36;
  (__return_storage_ptr__->dpdv).y = dVar5 * dVar3 + dVar18 * dVar40 + dVar19 * dVar35;
  (__return_storage_ptr__->dpdv).z = dVar5 * dVar4 + dVar18 * dVar2 + dVar19 * dVar1;
  dVar5 = (si->dndu).x;
  dVar6 = (si->dndu).y;
  dVar7 = (si->dndu).z;
  dVar35 = (this->invMat).d[0][2];
  dVar39 = (this->invMat).d[1][2];
  dVar36 = (this->invMat).d[2][2];
  dVar38 = (si->shadingGeom).n.x;
  dVar40 = (si->shadingGeom).n.y;
  dVar1 = (si->shadingGeom).n.z;
  dVar37 = dVar36 * dVar1 + dVar35 * dVar38 + dVar39 * dVar40;
  dVar8 = (this->invMat).d[1][0];
  dVar9 = (this->invMat).d[1][1];
  dVar10 = (this->invMat).d[2][0];
  dVar11 = (this->invMat).d[2][1];
  dVar20 = (this->invMat).d[0][0];
  dVar21 = (this->invMat).d[0][1];
  dVar22 = (this->invMat).d[0][1];
  dVar23 = (this->invMat).d[0][2];
  dVar18 = dVar7 * dVar10 + dVar5 * dVar20 + dVar6 * dVar8;
  dVar19 = dVar7 * dVar11 + dVar5 * dVar21 + dVar6 * dVar9;
  dVar2 = (si->dndv).y;
  dVar3 = (si->dndv).x;
  dVar4 = (si->dndv).z;
  dVar24 = (this->invMat).d[1][1];
  dVar25 = (this->invMat).d[1][2];
  dVar26 = (this->invMat).d[2][1];
  dVar27 = (this->invMat).d[2][2];
  auVar16._8_4_ = SUB84(dVar19,0);
  auVar16._0_8_ = dVar18;
  auVar16._12_4_ = (int)((ulong)dVar19 >> 0x20);
  (__return_storage_ptr__->dndu).x = dVar18;
  (__return_storage_ptr__->dndu).y = (double)auVar16._8_8_;
  dVar18 = dVar4 * dVar10 + dVar3 * dVar20 + dVar2 * dVar8;
  auVar13._8_4_ = SUB84(dVar18,0);
  auVar13._0_8_ = dVar7 * dVar36 + dVar5 * dVar35 + dVar6 * dVar39;
  auVar13._12_4_ = (int)((ulong)dVar18 >> 0x20);
  *(undefined1 (*) [16])&(__return_storage_ptr__->dndu).z = auVar13;
  (__return_storage_ptr__->dndv).y = dVar4 * dVar26 + dVar3 * dVar22 + dVar2 * dVar24;
  (__return_storage_ptr__->dndv).z = dVar4 * dVar27 + dVar3 * dVar23 + dVar2 * dVar25;
  dVar39 = dVar1 * dVar10 + dVar38 * dVar20 + dVar40 * dVar8;
  dVar36 = dVar1 * dVar11 + dVar38 * dVar21 + dVar40 * dVar9;
  dVar35 = dVar37 * dVar37 + dVar39 * dVar39 + dVar36 * dVar36;
  if (dVar35 < 0.0) {
    dVar35 = sqrt(dVar35);
  }
  else {
    dVar35 = SQRT(dVar35);
  }
  dVar35 = 1.0 / dVar35;
  dVar39 = dVar35 * dVar39;
  dVar36 = dVar35 * dVar36;
  dVar35 = dVar35 * dVar37;
  (__return_storage_ptr__->shadingGeom).n.x = dVar39;
  (__return_storage_ptr__->shadingGeom).n.y = dVar36;
  (__return_storage_ptr__->shadingGeom).n.z = dVar35;
  dVar9 = (si->shadingGeom).dpdu.x;
  dVar10 = (si->shadingGeom).dpdu.y;
  dVar38 = (this->mat).d[1][1];
  dVar40 = (this->mat).d[0][0];
  dVar1 = (this->mat).d[0][1];
  dVar2 = (this->mat).d[0][2];
  dVar3 = (this->mat).d[1][0];
  dVar4 = (this->mat).d[2][1];
  auVar14._8_4_ = SUB84(dVar1,0);
  auVar14._0_8_ = dVar4;
  auVar14._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dVar18 = (this->mat).d[2][0];
  dVar19 = (this->mat).d[1][2];
  dVar5 = (this->mat).d[2][2];
  dVar11 = (si->shadingGeom).dpdu.z;
  (__return_storage_ptr__->shadingGeom).dpdu.x = dVar11 * dVar2 + dVar9 * dVar40 + dVar10 * dVar1;
  (__return_storage_ptr__->shadingGeom).dpdu.y = dVar11 * dVar19 + dVar9 * dVar3 + dVar10 * dVar38;
  dVar6 = (si->shadingGeom).dpdv.y;
  dVar7 = (si->shadingGeom).dpdv.x;
  dVar8 = (si->shadingGeom).dpdv.z;
  (__return_storage_ptr__->shadingGeom).dpdu.z = dVar11 * dVar5 + dVar9 * dVar18 + dVar10 * dVar4;
  (__return_storage_ptr__->shadingGeom).dpdv.x = dVar8 * dVar2 + dVar7 * dVar40 + dVar6 * dVar1;
  (__return_storage_ptr__->shadingGeom).dpdv.y = dVar8 * dVar19 + dVar7 * dVar3 + dVar6 * dVar38;
  (__return_storage_ptr__->shadingGeom).dpdv.z = dVar8 * dVar5 + dVar7 * dVar18 + dVar6 * dVar4;
  dVar20 = (si->shadingGeom).dndu.x;
  dVar21 = (si->shadingGeom).dndu.y;
  dVar22 = (this->invMat).d[1][0];
  dVar9 = (this->invMat).d[1][1];
  dVar23 = (this->invMat).d[0][0];
  dVar10 = (this->invMat).d[0][1];
  dVar24 = (si->shadingGeom).dndu.z;
  dVar25 = (this->invMat).d[2][0];
  dVar11 = (this->invMat).d[2][1];
  dVar26 = (this->invMat).d[0][1];
  dVar27 = (this->invMat).d[0][2];
  dVar6 = (this->invMat).d[1][2];
  dVar7 = (this->invMat).d[0][2];
  dVar8 = (this->invMat).d[2][2];
  dVar37 = (this->invMat).d[1][1];
  dVar28 = (this->invMat).d[1][2];
  dVar29 = (this->invMat).d[2][1];
  dVar30 = (this->invMat).d[2][2];
  (__return_storage_ptr__->shadingGeom).dndu.x = dVar24 * dVar25 + dVar20 * dVar23 + dVar21 * dVar22
  ;
  (__return_storage_ptr__->shadingGeom).dndu.y = dVar24 * dVar11 + dVar20 * dVar10 + dVar21 * dVar9;
  dVar9 = (si->shadingGeom).dndv.y;
  dVar10 = (si->shadingGeom).dndv.x;
  dVar11 = (si->shadingGeom).dndv.z;
  (__return_storage_ptr__->shadingGeom).dndu.z = dVar24 * dVar8 + dVar20 * dVar7 + dVar21 * dVar6;
  (__return_storage_ptr__->shadingGeom).dndv.x = dVar11 * dVar25 + dVar10 * dVar23 + dVar9 * dVar22;
  (__return_storage_ptr__->shadingGeom).dndv.y = dVar11 * dVar29 + dVar10 * dVar26 + dVar9 * dVar37;
  (__return_storage_ptr__->shadingGeom).dndv.z = dVar11 * dVar30 + dVar10 * dVar27 + dVar9 * dVar28;
  __return_storage_ptr__->bsdf = si->bsdf;
  __return_storage_ptr__->object = si->object;
  dVar6 = si->dvdx;
  __return_storage_ptr__->dudx = si->dudx;
  __return_storage_ptr__->dvdx = dVar6;
  dVar6 = si->dvdy;
  __return_storage_ptr__->dudy = si->dudy;
  __return_storage_ptr__->dvdy = dVar6;
  dVar8 = (si->dpdx).x;
  dVar9 = (si->dpdx).y;
  dVar10 = (si->dpdx).z;
  (__return_storage_ptr__->dpdx).x = dVar10 * dVar2 + dVar8 * dVar40 + dVar9 * dVar1;
  (__return_storage_ptr__->dpdx).y = dVar10 * dVar19 + dVar8 * dVar3 + dVar9 * dVar38;
  dVar1 = (si->dpdy).y;
  dStack_40 = auVar14._8_8_;
  dVar6 = (si->dpdy).x;
  dVar7 = (si->dpdy).z;
  (__return_storage_ptr__->dpdx).z = dVar10 * dVar5 + dVar8 * dVar18 + dVar9 * dVar4;
  (__return_storage_ptr__->dpdy).x = dVar7 * dVar2 + dVar6 * dVar40 + dVar1 * dStack_40;
  dVar38 = dVar7 * dVar19 + dVar6 * dVar3 + dVar1 * dVar38;
  dVar40 = dVar7 * dVar5 + dVar6 * dVar18 + dVar1 * dVar4;
  auVar15._8_4_ = SUB84(dVar40,0);
  auVar15._0_8_ = dVar38;
  auVar15._12_4_ = (int)((ulong)dVar40 >> 0x20);
  (__return_storage_ptr__->dpdy).y = dVar38;
  (__return_storage_ptr__->dpdy).z = (double)auVar15._8_8_;
  bVar12 = (si->shadingGeom).overridesOrientation;
  (__return_storage_ptr__->shadingGeom).overridesOrientation = bVar12;
  dVar1 = (__return_storage_ptr__->super_Interaction).n.x;
  dVar2 = (__return_storage_ptr__->super_Interaction).n.y;
  dVar40 = dVar36 * dVar2;
  dVar38 = (__return_storage_ptr__->super_Interaction).n.z;
  if (bVar12 == true) {
    paVar33 = (anon_struct_128_6_d0712383_for_shadingGeom *)
              &(__return_storage_ptr__->super_Interaction).n;
    pNVar31 = &(__return_storage_ptr__->super_Interaction).n;
    pNVar32 = &(__return_storage_ptr__->super_Interaction).n;
    dVar40 = dVar35 * dVar38 + dVar39 * dVar1 + dVar40;
    dVar39 = dVar1;
    dVar36 = dVar2;
    dVar35 = dVar38;
  }
  else {
    paVar33 = &__return_storage_ptr__->shadingGeom;
    pNVar31 = &(__return_storage_ptr__->shadingGeom).n;
    pNVar32 = &(__return_storage_ptr__->shadingGeom).n;
    dVar40 = dVar38 * dVar35 + dVar1 * dVar39 + dVar40;
  }
  uVar34 = (uint)((ulong)dVar36 >> 0x20);
  if (dVar40 < 0.0) {
    dVar39 = -dVar39;
    uVar34 = uVar34 ^ 0x80000000;
  }
  (paVar33->n).x = dVar39;
  pNVar32->y = (double)CONCAT44(uVar34,SUB84(dVar36,0));
  pNVar31->z = (double)(~-(ulong)(dVar40 < 0.0) & (ulong)dVar35 |
                       (ulong)-dVar35 & -(ulong)(dVar40 < 0.0));
  return __return_storage_ptr__;
}

Assistant:

SurfaceInteraction Transform::operator()(const SurfaceInteraction& si) const {
    SurfaceInteraction nsi;
    const Transform& tr = *this;

    // Interaction members
    nsi.p = tr(si.p, si.pfError, &nsi.pfError);
    nsi.n = normalize(tr(si.n)); nsi.wo = normalize(tr(si.wo));

    // SurfaceInteraction members
    nsi.uv = si.uv; nsi.shape = si.shape;
    nsi.dpdu = tr(si.dpdu); nsi.dpdv = tr(si.dpdv);
    nsi.dndu = tr(si.dndu); nsi.dndv = tr(si.dndv);
    // SurfaceInteraction::shadingGeometry members
    nsi.shadingGeom.n = normalize(tr(si.shadingGeom.n));
    nsi.shadingGeom.dpdu = tr(si.shadingGeom.dpdu);
    nsi.shadingGeom.dpdv = tr(si.shadingGeom.dpdv);
    nsi.shadingGeom.dndu = tr(si.shadingGeom.dndu);
    nsi.shadingGeom.dndv = tr(si.shadingGeom.dndv);

    nsi.bsdf = si.bsdf; nsi.object = si.object;
    nsi.dudx = si.dudx; nsi.dvdx = si.dvdx;
    nsi.dudy = si.dudy; nsi.dvdy = si.dvdy;
    nsi.dpdx = tr(si.dpdx); nsi.dpdy = tr(si.dpdy);

    // Check if normals should be readjusted
    nsi.shadingGeom.overridesOrientation = si.shadingGeom.overridesOrientation;
    if (nsi.shadingGeom.overridesOrientation)
        nsi.n = faceForward(nsi.n, nsi.shadingGeom.n);
    else
        nsi.shadingGeom.n = faceForward(nsi.shadingGeom.n, nsi.n);

    return nsi;
}